

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O3

void __thiscall
CNetAddr::
UnserializeV2Stream<ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>>
          (CNetAddr *this,
          ParamsStream<ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
          *s)

{
  uint uVar1;
  HashVerifier<DataStream> *this_00;
  uint uVar2;
  bool bVar3;
  uint64_t address_size_00;
  CNetAddr *pCVar4;
  string *psVar5;
  size_t in_RCX;
  long lVar6;
  unsigned_long *in_R8;
  long in_FS_OFFSET;
  size_t address_size;
  uint8_t bip155_net;
  uint64_t local_60;
  uint8_t local_51;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>::
  operator>>((ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>
              *)s,&local_51);
  address_size_00 =
       ReadCompactSize<ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>>
                 (s,true);
  local_60 = address_size_00;
  if (0x200 < address_size_00) {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_long,unsigned_long>
              (&local_50,(tinyformat *)"Address too long: %u > %u",(char *)&local_60,
               &MAX_ADDRV2_SIZE,in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar5);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(psVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_00448784;
  }
  this->m_scope_id = 0;
  bVar3 = SetNetFromBIP155Network(this,local_51,address_size_00);
  if (!bVar3) {
    HashVerifier<DataStream>::ignore(s->m_substream->m_substream,address_size_00);
    goto LAB_00448654;
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,(size_type)address_size_00)
  ;
  uVar1 = (this->m_addr)._size;
  uVar2 = uVar1 - 0x11;
  pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
  if (uVar1 < 0x11) {
    uVar2 = uVar1;
    pCVar4 = this;
  }
  this_00 = s->m_substream->m_substream;
  DataStream::read(this_00->m_source,(int)pCVar4,(void *)(ulong)uVar2,in_RCX);
  CSHA256::Write((CSHA256 *)this_00,(uchar *)pCVar4,(size_t)(ulong)uVar2);
  if (this->m_net == NET_IPV6) {
    uVar1 = (this->m_addr)._size;
    uVar2 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar2 = uVar1;
    }
    if (5 < uVar2) {
      pCVar4 = this;
      if (0x10 < uVar1) {
        pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      lVar6 = 0;
      do {
        if (INTERNAL_IN_IPV6_PREFIX._M_elems[lVar6] != (pCVar4->m_addr)._union.direct[lVar6]) {
          if (uVar2 < 0xc) goto LAB_004486b4;
          lVar6 = 0;
          goto LAB_0044869f;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      this->m_net = NET_INTERNAL;
      (pCVar4->m_addr)._union.indirect_contents.indirect =
           *(char **)((long)&(pCVar4->m_addr)._union.indirect_contents.indirect + 6);
      *(undefined2 *)((long)&(pCVar4->m_addr)._union + 8) =
           *(undefined2 *)((long)&(pCVar4->m_addr)._union + 0xe);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,10);
    }
  }
  goto LAB_00448670;
  while (lVar6 = lVar6 + 1, lVar6 != 0xc) {
LAB_0044869f:
    if (IPV4_IN_IPV6_PREFIX._M_elems[lVar6] != (pCVar4->m_addr)._union.direct[lVar6])
    goto LAB_004486b4;
  }
  goto LAB_00448654;
LAB_004486b4:
  lVar6 = 0;
  do {
    if (TORV2_IN_IPV6_PREFIX._M_elems[lVar6] != (pCVar4->m_addr)._union.direct[lVar6])
    goto LAB_00448670;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
LAB_00448654:
  this->m_net = NET_IPV6;
  local_50._M_dataplus._M_p._0_1_ = 0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::assign(&this->m_addr,0x10,(uchar *)&local_50);
LAB_00448670:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00448784:
  __stack_chk_fail();
}

Assistant:

void UnserializeV2Stream(Stream& s)
    {
        uint8_t bip155_net;
        s >> bip155_net;

        size_t address_size;
        s >> COMPACTSIZE(address_size);

        if (address_size > MAX_ADDRV2_SIZE) {
            throw std::ios_base::failure(strprintf(
                "Address too long: %u > %u", address_size, MAX_ADDRV2_SIZE));
        }

        m_scope_id = 0;

        if (SetNetFromBIP155Network(bip155_net, address_size)) {
            m_addr.resize(address_size);
            s >> Span{m_addr};

            if (m_net != NET_IPV6) {
                return;
            }

            // Do some special checks on IPv6 addresses.

            // Recognize NET_INTERNAL embedded in IPv6, such addresses are not
            // gossiped but could be coming from addrman, when unserializing from
            // disk.
            if (util::HasPrefix(m_addr, INTERNAL_IN_IPV6_PREFIX)) {
                m_net = NET_INTERNAL;
                memmove(m_addr.data(), m_addr.data() + INTERNAL_IN_IPV6_PREFIX.size(),
                        ADDR_INTERNAL_SIZE);
                m_addr.resize(ADDR_INTERNAL_SIZE);
                return;
            }

            if (!util::HasPrefix(m_addr, IPV4_IN_IPV6_PREFIX) &&
                !util::HasPrefix(m_addr, TORV2_IN_IPV6_PREFIX)) {
                return;
            }

            // IPv4 and TORv2 are not supposed to be embedded in IPv6 (like in V1
            // encoding). Unserialize as !IsValid(), thus ignoring them.
        } else {
            // If we receive an unknown BIP155 network id (from the future?) then
            // ignore the address - unserialize as !IsValid().
            s.ignore(address_size);
        }

        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
    }